

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

long ov_bitrate(OggVorbis_File *vf,int i)

{
  long lVar1;
  long lVar2;
  double dVar3;
  int local_2c;
  float br;
  int i_1;
  ogg_int64_t bits;
  int i_local;
  OggVorbis_File *vf_local;
  
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else if (i < vf->links) {
    if ((vf->seekable == 0) && (i != 0)) {
      vf_local = (OggVorbis_File *)ov_bitrate(vf,0);
    }
    else if (i < 0) {
      _br = 0;
      for (local_2c = 0; local_2c < vf->links; local_2c = local_2c + 1) {
        _br = (vf->offsets[local_2c + 1] - vf->dataoffsets[local_2c]) * 8 + _br;
      }
      dVar3 = ov_time_total(vf,-1);
      dVar3 = rint((double)(float)((double)_br / dVar3));
      vf_local = (OggVorbis_File *)(long)dVar3;
    }
    else if (vf->seekable == 0) {
      if (vf->vi[i].bitrate_nominal < 1) {
        if (vf->vi[i].bitrate_upper < 1) {
          vf_local = (OggVorbis_File *)0xffffffffffffffff;
        }
        else if (vf->vi[i].bitrate_lower < 1) {
          vf_local = (OggVorbis_File *)vf->vi[i].bitrate_upper;
        }
        else {
          vf_local = (OggVorbis_File *)((vf->vi[i].bitrate_upper + vf->vi[i].bitrate_lower) / 2);
        }
      }
      else {
        vf_local = (OggVorbis_File *)vf->vi[i].bitrate_nominal;
      }
    }
    else {
      lVar1 = vf->offsets[i + 1];
      lVar2 = vf->dataoffsets[i];
      dVar3 = ov_time_total(vf,i);
      dVar3 = rint((double)((lVar1 - lVar2) * 8) / dVar3);
      vf_local = (OggVorbis_File *)(long)dVar3;
    }
  }
  else {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  return (long)vf_local;
}

Assistant:

long ov_bitrate(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(i>=vf->links)return(OV_EINVAL);
  if(!vf->seekable && i!=0)return(ov_bitrate(vf,0));
  if(i<0){
    ogg_int64_t bits=0;
    int i;
    float br;
    for(i=0;i<vf->links;i++)
      bits+=(vf->offsets[i+1]-vf->dataoffsets[i])*8;
    /* This once read: return(rint(bits/ov_time_total(vf,-1)));
     * gcc 3.x on x86 miscompiled this at optimisation level 2 and above,
     * so this is slightly transformed to make it work.
     */
    br = bits/ov_time_total(vf,-1);
    return(rint(br));
  }else{
    if(vf->seekable){
      /* return the actual bitrate */
      return(rint((vf->offsets[i+1]-vf->dataoffsets[i])*8/ov_time_total(vf,i)));
    }else{
      /* return nominal if set */
      if(vf->vi[i].bitrate_nominal>0){
        return vf->vi[i].bitrate_nominal;
      }else{
        if(vf->vi[i].bitrate_upper>0){
          if(vf->vi[i].bitrate_lower>0){
            return (vf->vi[i].bitrate_upper+vf->vi[i].bitrate_lower)/2;
          }else{
            return vf->vi[i].bitrate_upper;
          }
        }
        return(OV_FALSE);
      }
    }
  }
}